

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

bool __thiscall
GraphPropagator::coherence_outedges
          (GraphPropagator *this,int node,vector<int,_std::allocator<int>_> *remvd_e)

{
  char cVar1;
  uint uVar2;
  pointer pvVar3;
  BoolView *pBVar4;
  iterator __position;
  bool bVar5;
  undefined4 uVar6;
  pointer piVar7;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar8;
  ulong uVar9;
  size_t __size;
  bool bVar10;
  edge_id edge;
  vec<Lit> ps;
  Clause *expl;
  uint local_5c;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  void *pvStack_50;
  Clause *local_48;
  ulong local_40;
  long local_38;
  
  pvVar3 = (this->adj).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = pvVar3[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar10 = *(pointer *)
            ((long)&pvVar3[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8) == piVar7;
  if (!bVar10) {
    local_40 = (ulong)(uint)node;
    local_38 = local_40 << 4;
    uVar8 = 0;
    uVar9 = 1;
    do {
      local_5c = piVar7[uVar8];
      pBVar4 = (this->es).data;
      cVar1 = sat.assigns.data[(uint)pBVar4[local_5c].v];
      if (cVar1 == '\0') {
LAB_001cba92:
        if (so.lazy == true) {
          local_58._pt = (Clause *)malloc(0x10);
          *(uint *)local_58._pt = *(uint *)local_58._pt & 0xfc | 0x202;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_58._pt);
          if (*(uint *)local_58._pt < 0x200) {
            abort();
          }
          uVar2 = *(uint *)((long)&((this->vs).data)->v + local_38);
          *(uint *)(local_58._a + 8) =
               (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2;
          r = local_58;
        }
        else {
          r._pt = (Clause *)0x0;
        }
        pBVar4 = (this->es).data;
        SAT::enqueue(&sat,(Lit)((pBVar4[local_5c].s ^ 1) + pBVar4[local_5c].v * 2),(Reason)r);
        __position._M_current =
             (remvd_e->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (remvd_e->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)remvd_e,__position,(int *)&local_5c);
        }
        else {
          *__position._M_current = local_5c;
          (remvd_e->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      else {
        if (((uint)pBVar4[local_5c].s ^ (int)(char)(((int)cVar1 - (cVar1 + 1 >> 0x1f)) + 1U >> 1))
            == 1) {
          if (so.lazy != true) {
            return bVar10;
          }
          local_58._pt = (Clause *)0x0;
          pvStack_50 = (void *)0x0;
          local_48._0_4_ =
               (uint)((int)sat.assigns.data[(uint)pBVar4[local_5c].v] - 1U < 0xfffffffd) +
               pBVar4[local_5c].v * 2;
          vec<Lit>::push((vec<Lit> *)&local_58,(Lit *)&local_48);
          uVar2 = (this->vs).data[local_40].v;
          local_48 = (Clause *)
                     CONCAT44(local_48._4_4_,
                              (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2);
          vec<Lit>::push((vec<Lit> *)&local_58,(Lit *)&local_48);
          uVar6 = local_58._a._0_4_;
          uVar8 = local_58._a & 0xffffffff;
          __size = 8;
          if (local_58._a._0_4_ != 0) {
            __size = (ulong)(local_58._a._0_4_ - 1) * 4 + 8;
          }
          local_48 = (Clause *)malloc(__size);
          uVar2 = *(uint *)local_48;
          local_48->data[0].x = -2;
          *(uint *)local_48 = uVar2 & 0xfc | uVar6 << 8;
          if (uVar6 != 0) {
            uVar9 = 0;
            do {
              local_48->data[uVar9].x = *(int *)((long)pvStack_50 + uVar9 * 4);
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
          }
          *(byte *)local_48 = *(byte *)local_48 | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_48);
          sat.confl = local_48;
          if (pvStack_50 == (void *)0x0) {
            return bVar10;
          }
          free(pvStack_50);
          return bVar10;
        }
        if (cVar1 == '\0') goto LAB_001cba92;
      }
      pvVar3 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar7 = pvVar3[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (long)*(pointer *)
                     ((long)&pvVar3[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8) - (long)piVar7 >> 2;
      bVar10 = uVar8 <= uVar9;
      bVar5 = uVar9 < uVar8;
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar5);
  }
  return bVar10;
}

Assistant:

bool GraphPropagator::coherence_outedges(int node, std::vector<edge_id>& remvd_e) {
	for (unsigned int i = 0; i < adj[node].size(); i++) {
		const edge_id edge = adj[node][i];
		// Edge with missing an endnode
		if (es[edge].isFixed() && es[edge].getVal() == 1) {
			if (so.lazy) {
				vec<Lit> ps;
				ps.push(es[edge].getValLit());
				ps.push(vs[node].getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		// Edge that must be removed
		if (!es[edge].isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = vs[node].getValLit();
			}
			if (GRAPHPROP_DEBUG) {
				std::cout << "COHERENCE (E) " << edge << '\n';
			}
			es[edge].setVal2(false, r);
			remvd_e.push_back(edge);
		}
	}
	return true;
}